

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# size.h
# Opt level: O2

Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *
gimage::downscaleImage<unsigned_short>
          (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *__return_storage_ptr__,
          Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *image,int factor)

{
  unsigned_short ***pppuVar1;
  long lVar2;
  long lVar3;
  unsigned_short ***pppuVar4;
  unsigned_short ***pppuVar5;
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  int iVar10;
  ulong uVar11;
  unsigned_short *puVar12;
  long lVar13;
  ushort *puVar14;
  long lVar15;
  int kk;
  int iVar16;
  ulong uVar17;
  unsigned_short *puVar18;
  ulong *puVar19;
  ulong uVar20;
  long lVar21;
  int ii;
  int iVar22;
  long lVar23;
  long i;
  long lVar24;
  ulong uVar25;
  bool bVar26;
  long local_68;
  
  if (factor < 2) {
    Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::Image(__return_storage_ptr__,image)
    ;
  }
  else {
    uVar25 = (ulong)(uint)factor;
    Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::Image
              (__return_storage_ptr__,(long)(image->width + (uVar25 - 1)) / (long)uVar25,
               (long)((uVar25 - 1) + image->height) / (long)uVar25,image->depth);
    pppuVar1 = __return_storage_ptr__->img;
    lVar2 = image->height;
    uVar17 = 0;
    uVar11 = (ulong)(uint)image->depth;
    if (image->depth < 1) {
      uVar11 = uVar17;
    }
    lVar3 = image->width;
    for (; uVar17 != uVar11; uVar17 = uVar17 + 1) {
      puVar18 = *pppuVar1[uVar17];
      lVar23 = image->width;
      pppuVar4 = image->img;
      local_68 = 0;
      lVar24 = local_68;
      while (local_68 = lVar24, lVar24 = local_68 + uVar25, lVar24 <= lVar2) {
        pppuVar5 = image->img;
        if (factor == 2) {
          lVar21 = 0;
          while (lVar21 + 2 <= lVar23) {
            puVar12 = pppuVar5[uVar17][local_68];
            *(short *)((long)puVar18 + lVar21) =
                 (short)((uint)puVar12[lVar21 + lVar23 + 1] +
                         (uint)puVar12[lVar21 + lVar23] +
                         (uint)puVar12[lVar21 + 1] + (uint)puVar12[lVar21] + 2 >> 2);
            lVar21 = lVar21 + 2;
          }
          puVar18 = (unsigned_short *)((long)puVar18 + lVar21);
        }
        else if (factor == 3) {
          lVar13 = 4;
          lVar21 = 0;
          while (lVar21 + 3 <= lVar23) {
            puVar14 = (ushort *)((long)pppuVar5[uVar17][local_68] + lVar13);
            iVar10 = 0;
            iVar16 = 3;
            while (bVar26 = iVar16 != 0, iVar16 = iVar16 + -1, bVar26) {
              iVar10 = iVar10 + (uint)puVar14[-2] + (uint)*puVar14 + (uint)puVar14[-1];
              puVar14 = puVar14 + lVar23;
            }
            *puVar18 = (unsigned_short)((ulong)(iVar10 + 4) / 9);
            puVar18 = puVar18 + 1;
            lVar13 = lVar13 + 6;
            lVar21 = lVar21 + 3;
          }
        }
        else if (factor == 4) {
          lVar13 = 0;
          lVar21 = 0;
          while (lVar21 + 4 <= lVar23) {
            puVar19 = (ulong *)((long)pppuVar5[uVar17][local_68] + lVar13);
            iVar10 = 0;
            iVar16 = 4;
            while (bVar26 = iVar16 != 0, iVar16 = iVar16 + -1, bVar26) {
              uVar20 = *puVar19;
              auVar6._8_4_ = 0;
              auVar6._0_8_ = uVar20;
              auVar6._12_2_ = (short)(uVar20 >> 0x30);
              auVar7._8_2_ = (short)(uVar20 >> 0x20);
              auVar7._0_8_ = uVar20;
              auVar7._10_4_ = auVar6._10_4_;
              auVar9._6_8_ = 0;
              auVar9._0_6_ = auVar7._8_6_;
              auVar8._4_2_ = (short)(uVar20 >> 0x10);
              auVar8._0_4_ = (uint)uVar20;
              auVar8._6_8_ = SUB148(auVar9 << 0x40,6);
              iVar10 = iVar10 + (auVar6._10_4_ >> 0x10) + auVar8._4_4_ +
                                auVar7._8_4_ + ((uint)uVar20 & 0xffff);
              puVar19 = (ulong *)((long)puVar19 + lVar23 * 2);
            }
            *puVar18 = (unsigned_short)(iVar10 + 8U >> 4);
            puVar18 = puVar18 + 1;
            lVar13 = lVar13 + 8;
            lVar21 = lVar21 + 4;
          }
        }
        else {
          lVar13 = 0;
          lVar21 = 0;
          while ((long)(lVar21 + uVar25) <= lVar23) {
            lVar15 = (long)pppuVar5[uVar17][local_68] + lVar13;
            iVar16 = 0;
            for (iVar10 = 0; iVar10 != factor; iVar10 = iVar10 + 1) {
              for (uVar20 = 0; uVar25 != uVar20; uVar20 = uVar20 + 1) {
                iVar16 = iVar16 + (uint)*(ushort *)(lVar15 + uVar20 * 2);
              }
              lVar15 = lVar15 + lVar23 * 2;
            }
            *puVar18 = (unsigned_short)((iVar16 + (factor * factor >> 1)) / (factor * factor));
            puVar18 = puVar18 + 1;
            lVar13 = lVar13 + uVar25 * 2;
            lVar21 = lVar21 + uVar25;
          }
        }
        if (lVar21 < lVar23) {
          puVar12 = pppuVar4[uVar17][local_68] + lVar21;
          iVar22 = 0;
          iVar16 = 0;
          for (iVar10 = 0; iVar10 != factor; iVar10 = iVar10 + 1) {
            for (uVar20 = 0; (uVar25 != uVar20 && (lVar23 - lVar21 != uVar20)); uVar20 = uVar20 + 1)
            {
              iVar22 = iVar22 + (uint)puVar12[uVar20];
            }
            puVar12 = puVar12 + lVar23;
            iVar16 = iVar16 + (int)uVar20;
          }
          *puVar18 = (unsigned_short)(((iVar16 >> 1) + iVar22) / iVar16);
          puVar18 = puVar18 + 1;
        }
      }
      if (local_68 < lVar2) {
        pppuVar4 = image->img;
        for (lVar24 = 0; lVar24 < lVar3; lVar24 = lVar24 + uVar25) {
          puVar12 = pppuVar4[uVar17][local_68];
          iVar16 = 0;
          iVar10 = 0;
          for (uVar20 = 0; (uVar20 < uVar25 && ((long)(local_68 + uVar20) < lVar2));
              uVar20 = uVar20 + 1) {
            lVar21 = 0;
            for (lVar23 = lVar24; (-lVar21 != uVar25 && (lVar23 < lVar3)); lVar23 = lVar23 + 1) {
              iVar16 = iVar16 + (uint)puVar12[lVar23];
              lVar21 = lVar21 + -1;
            }
            puVar12 = puVar12 + lVar3;
            iVar10 = iVar10 - (int)lVar21;
          }
          *puVar18 = (unsigned_short)(((iVar10 >> 1) + iVar16) / iVar10);
          puVar18 = puVar18 + 1;
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Image<T> downscaleImage(const Image<T> &image, int factor)
{
  factor=std::max(1, factor);

  if (factor == 1)
  {
    return image;
  }

  Image<T> ret((image.getWidth()+factor-1)/factor,
               (image.getHeight()+factor-1)/factor, image.getDepth());

  for (int d=0; d<image.getDepth(); d++)
  {
    T *out=ret.getPtr(0, 0, d);

    long k=0;

    while (k+factor <= image.getHeight())
    {
      long i=0;

      if (factor == 2)
      {
        // speeding up special case of averaging over 2*2 pixels

        while (i+2 <= image.getWidth())
        {
          typename Image<T>::work_t v;

          const T *in=image.getPtr(i, k, d);

          v=*in+in[1];
          in+=image.getWidth();
          v+=*in+in[1];

          *out++=static_cast<typename Image<T>::store_t>((v+2)/4);
          i+=2;
        }
      }
      else if (factor == 3)
      {
        // speeding up special case of averaging over 3*3 pixels

        while (i+3 <= image.getWidth())
        {
          typename Image<T>::work_t v=0;

          const T *in=image.getPtr(i, k, d);

          for (int j=0; j<3; j++)
          {
            v+=*in+in[1]+in[2];
            in+=image.getWidth();
          }

          *out++=static_cast<typename Image<T>::store_t>((v+4)/9);
          i+=3;
        }
      }
      else if (factor == 4)
      {
        // speeding up special case of averaging over 4*4 pixels

        while (i+4 <= image.getWidth())
        {
          typename Image<T>::work_t v=0;

          const T *in=image.getPtr(i, k, d);

          for (int j=0; j<4; j++)
          {
            v+=*in+in[1]+in[2]+in[3];
            in+=image.getWidth();
          }

          *out++=static_cast<typename Image<T>::store_t>((v+8)/16);
          i+=4;
        }
      }
      else
      {
        // average over factor*factor pixels of the input image

        while (i+factor <= image.getWidth())
        {
          typename Image<T>::work_t v=0;
          int n=0;

          const T *in=image.getPtr(i, k, d);

          for (int kk=0; kk<factor; kk++)
          {
            for (int ii=0; ii<factor; ii++)
            {
              v+=in[ii];
              n++;
            }

            in+=image.getWidth();
          }

          *out++=static_cast<typename Image<T>::store_t>((v+(n>>1))/n);
          i+=factor;
        }
      }

      // if there are less than factor pixels left in the image row, then
      // average with boundary check

      if (i < image.getWidth())
      {
        typename Image<T>::work_t v=0;
        int n=0;

        const T *in=image.getPtr(i, k, d);

        for (int kk=0; kk<factor; kk++)
        {
          for (int ii=0; ii<factor && i+ii<image.getWidth(); ii++)
          {
            v+=in[ii];
            n++;
          }

          in+=image.getWidth();
        }

        *out++=static_cast<typename Image<T>::store_t>((v+(n>>1))/n);
      }

      k+=factor;
    }

    // if there are less than factor image rows left in the image, then
    // average with boundary check

    if (k < image.getHeight())
    {
      for (long i=0; i<image.getWidth(); i+=factor)
      {
        typename Image<T>::work_t v=0;
        int n=0;

        const T *in=image.getPtr(i, k, d);

        for (int kk=0; kk<factor && k+kk<image.getHeight(); kk++)
        {
          for (int ii=0; ii<factor && i+ii<image.getWidth(); ii++)
          {
            v+=in[ii];
            n++;
          }

          in+=image.getWidth();
        }

        *out++=static_cast<typename Image<T>::store_t>((v+(n>>1))/n);
      }
    }
  }

  return ret;
}